

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram.c
# Opt level: O3

int64_t hdr_size_of_equivalent_value_range(hdr_histogram *h,int64_t value)

{
  long lVar1;
  char cVar2;
  char cVar3;
  ulong uVar4;
  
  uVar4 = h->sub_bucket_mask | value;
  lVar1 = 0x3f;
  if (uVar4 != 0) {
    for (; uVar4 >> lVar1 == 0; lVar1 = lVar1 + -1) {
    }
  }
  cVar3 = (char)h->unit_magnitude;
  cVar2 = (char)h->sub_bucket_half_count_magnitude + cVar3 + ((byte)lVar1 ^ 0x3f);
  return 1L << ((h->sub_bucket_count <= (int)(value >> ((cVar3 - cVar2) + 0x3fU & 0x3f))) +
                (cVar3 - cVar2) + 0x3fU & 0x3f);
}

Assistant:

int64_t hdr_size_of_equivalent_value_range(const struct hdr_histogram* h, int64_t value)
{
    int32_t bucket_index     = get_bucket_index(h, value);
    int32_t sub_bucket_index = get_sub_bucket_index(value, bucket_index, h->unit_magnitude);
    int32_t adjusted_bucket  = (sub_bucket_index >= h->sub_bucket_count) ? (bucket_index + 1) : bucket_index;
    return INT64_C(1) << (h->unit_magnitude + adjusted_bucket);
}